

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_concurrency_test.cc
# Opt level: O0

void multi_file_write_with_inmem_snap(char *test_name)

{
  int *piVar1;
  undefined1 *__src;
  undefined1 *puVar2;
  ulong uVar3;
  void *pvVar4;
  void **ppvVar5;
  char *__s;
  undefined1 auStack_b48 [32];
  void *apvStack_b28 [4];
  pthread_t apStack_b08 [12];
  shared_data asStack_aa8 [94];
  undefined8 local_1d0;
  undefined1 *local_1c8;
  int local_1c0;
  int local_1bc;
  int i_1;
  int j;
  int iStack_1b0;
  int iStack_1ac;
  undefined8 local_1a8;
  undefined1 local_1a0 [252];
  uint local_a4;
  undefined1 *puStack_a0;
  int i;
  void **thread_ret;
  pthread_t *tid;
  shared_data *test_data;
  writer_thread_args *wargs;
  fdb_status status;
  int r;
  int num_docs;
  int inmem_snap_freq;
  int num_inmem_snaps;
  int num_writers;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  char *test_name_local;
  
  local_1d0 = 0x1041fc;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  local_1d0 = 0x104209;
  memleak_start();
  inmem_snap_freq = 4;
  num_docs = 4;
  r = 10;
  status = 26000;
  test_data = asStack_aa8;
  tid = apStack_b08;
  thread_ret = apvStack_b28;
  puVar2 = auStack_b48;
  puStack_a0 = puVar2;
  wargs._4_4_ = system("rm -rf ./bigfile* > errorlog.txt");
  local_a4 = inmem_snap_freq;
  while (local_a4 = local_a4 - 1, -1 < (int)local_a4) {
    *(long *)((long)test_data + (long)(int)local_a4 * 0x238) = (long)status;
    local_1c8 = local_1a0;
    *(undefined8 *)(puVar2 + -8) = 0x1042fe;
    fdb_get_default_config();
    __src = local_1c8;
    pvVar4 = (void *)((long)test_data + (long)(int)local_a4 * 0x238 + 0x18);
    *(undefined8 *)(puVar2 + -8) = 0x104326;
    memcpy(pvVar4,__src,0xf8);
    *(undefined8 *)((long)test_data + (long)(int)local_a4 * 0x238 + 0x20) = 0;
    *(undefined8 *)(puVar2 + -8) = 0x10434d;
    fdb_get_default_kvs_config();
    *(undefined8 *)((long)test_data + (long)(int)local_a4 * 0x238 + 0x120) = local_1a8;
    piVar1 = (int *)((long)test_data + (long)(int)local_a4 * 0x238 + 0x110);
    *piVar1 = i_1;
    piVar1[1] = j;
    piVar1[2] = iStack_1b0;
    piVar1[3] = iStack_1ac;
    *(undefined8 *)((long)test_data + (long)(int)local_a4 * 0x238 + 8) = 0xa28;
    *(undefined1 *)((long)test_data + (long)(int)local_a4 * 0x238 + 0x228) = 1;
    *(int *)((long)tid + (long)(int)local_a4 * 0x18 + 4) = num_docs;
    *(int *)(tid + (long)(int)local_a4 * 3) = r;
    puVar2 = puVar2 + -((long)num_docs * 8 + 0xfU & 0xfffffffffffffff0);
    tid[(long)(int)local_a4 * 3 + 1] = (pthread_t)puVar2;
    local_1bc = num_docs;
    while (local_1bc = local_1bc + -1, -1 < local_1bc) {
      *(undefined8 *)(tid[(long)(int)local_a4 * 3 + 1] + (long)local_1bc * 8) = 0;
    }
    *(pthread_t **)((long)test_data + (long)(int)local_a4 * 0x238 + 0x230) =
         tid + (long)(int)local_a4 * 3;
    *(undefined8 *)((long)test_data + (long)(int)local_a4 * 0x238 + 0x10) = 0x104;
    __s = (char *)((long)test_data + (long)(int)local_a4 * 0x238 + 0x128);
    uVar3 = (ulong)local_a4;
    *(undefined8 *)(puVar2 + -8) = 0x1044e8;
    sprintf(__s,"%s_%d","./bigfile",uVar3);
    ppvVar5 = thread_ret + (int)local_a4;
    pvVar4 = (void *)((long)test_data + (long)(int)local_a4 * 0x238);
    *(undefined8 *)(puVar2 + -8) = 0x104522;
    pthread_create((pthread_t *)ppvVar5,(pthread_attr_t *)0x0,_writer_thread,pvVar4);
  }
  for (local_1c0 = 0; local_1c0 < inmem_snap_freq; local_1c0 = local_1c0 + 1) {
    pvVar4 = thread_ret[local_1c0];
    ppvVar5 = (void **)(puStack_a0 + (long)local_1c0 * 8);
    *(undefined8 *)(puVar2 + -8) = 0x104577;
    pthread_join((pthread_t)pvVar4,ppvVar5);
  }
  *(undefined8 *)(puVar2 + -8) = 0x10458d;
  wargs._0_4_ = fdb_shutdown();
  if ((fdb_status)wargs != FDB_RESULT_SUCCESS) {
    *(undefined8 *)(puVar2 + -8) = 0x1045ba;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_concurrency_test.cc"
            ,0xef);
    multi_file_write_with_inmem_snap::__test_pass = 0;
    if ((fdb_status)wargs != FDB_RESULT_SUCCESS) {
      *(undefined8 *)(puVar2 + -8) = 0x1045eb;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/big_concurrency_test.cc"
                    ,0xef,"void multi_file_write_with_inmem_snap(const char *)");
    }
  }
  *(undefined8 *)(puVar2 + -8) = 0x1045f2;
  memleak_end();
  if (multi_file_write_with_inmem_snap::__test_pass == 0) {
    *(undefined8 *)(puVar2 + -8) = 0x104635;
    fprintf(_stderr,"%s FAILED\n",test_name);
  }
  else {
    *(undefined8 *)(puVar2 + -8) = 0x104617;
    fprintf(_stderr,"%s PASSED\n",test_name);
  }
  return;
}

Assistant:

void multi_file_write_with_inmem_snap(const char *test_name) {
    TEST_INIT();
    memleak_start();

    int num_writers = 4;
    int num_inmem_snaps = 4;
    int inmem_snap_freq = 10;
    int num_docs = NUM_FRUITS*1000;
    int r;
    fdb_status status;
    struct writer_thread_args *wargs = alca(struct writer_thread_args,
                                       num_writers);
    struct shared_data *test_data = alca(struct shared_data, num_writers);
    thread_t *tid = alca(thread_t, num_writers);
    void **thread_ret = alca(void *, num_writers);

    // remove previous test files
    r = system(SHELL_DEL TEST_FILENAME "* > errorlog.txt");
    (void) r;

    for (int i = num_writers - 1; i >= 0; --i) {
        // Writer Thread Config:
        wargs[i].ndocs = num_docs;
        wargs[i].config = fdb_get_default_config();
        wargs[i].config.buffercache_size = 0;
        wargs[i].kvs_config = fdb_get_default_kvs_config();
        wargs[i].batch_size = NUM_FRUITS*100;
        wargs[i].commit_opt = FDB_COMMIT_MANUAL_WAL_FLUSH;
        test_data[i].num_inmem_snaps = num_inmem_snaps;
        test_data[i].inmem_snap_freq = inmem_snap_freq;
        test_data[i].inmem_snaps = alca(fdb_kvs_handle *, num_inmem_snaps);
        for(int j = num_inmem_snaps - 1; j >=0; --j) {
            test_data[i].inmem_snaps[j] = NULL;
        }
        wargs[i].test = &test_data[i];
        wargs[i].clone_frequency = NUM_FRUITS*10;
        sprintf(wargs[i].test_file_name, "%s_%d", TEST_FILENAME, i);

        thread_create(&tid[i], _writer_thread, &wargs[i]);
    }

    // wait for thread termination
    for (int i = 0; i < num_writers; ++i) {
        thread_join(tid[i], &thread_ret[i]);
    }

    // shutdown
    status = fdb_shutdown();
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    memleak_end();
    TEST_RESULT(test_name);
}